

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

_Bool duckdb_je_emap_split_prepare
                (tsdn_t *tsdn,emap_t *emap,emap_prepare_t *prepare,edata_t *edata,size_t size_a,
                edata_t *trail,size_t size_b)

{
  rtree_ctx_t *ctx;
  _Bool _Var1;
  edata_t lead;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  lead.field_6.e_slab_data.bitmap[6] = 0;
  lead.field_6.e_slab_data.bitmap[7] = 0;
  lead.field_6.e_slab_data.bitmap[4] = 0;
  lead.field_6.e_slab_data.bitmap[5] = 0;
  lead.field_6.e_slab_data.bitmap[2] = 0;
  lead.field_6.e_slab_data.bitmap[3] = 0;
  lead.field_6.ql_link_inactive.qre_next = (edata_t *)0x0;
  lead.field_6.ql_link_inactive.qre_prev = (edata_t *)0x0;
  lead.field_5.ql_link_active.qre_prev = (edata_t *)0x0;
  lead.field_5._16_8_ = 0;
  lead.field_5.ql_link_active.qre_next = (edata_t *)0x0;
  lead.e_ps = (hpdata_t *)0x0;
  lead.e_addr = edata->e_addr;
  lead.e_bits = 0;
  lead.e_sn = 0;
  lead.field_2.e_size_esn = size_a;
  emap_rtree_leaf_elms_lookup
            (tsdn,emap,ctx,&lead,false,true,&prepare->lead_elm_a,&prepare->lead_elm_b);
  emap_rtree_leaf_elms_lookup
            (tsdn,emap,ctx,trail,false,true,&prepare->trail_elm_a,&prepare->trail_elm_b);
  _Var1 = true;
  if (((prepare->lead_elm_a != (rtree_leaf_elm_t *)0x0) &&
      (prepare->lead_elm_b != (rtree_leaf_elm_t *)0x0)) &&
     (prepare->trail_elm_a != (rtree_leaf_elm_t *)0x0)) {
    _Var1 = prepare->trail_elm_b == (rtree_leaf_elm_t *)0x0;
  }
  return _Var1;
}

Assistant:

bool
emap_split_prepare(tsdn_t *tsdn, emap_t *emap, emap_prepare_t *prepare,
    edata_t *edata, size_t size_a, edata_t *trail, size_t size_b) {
	EMAP_DECLARE_RTREE_CTX;

	/*
	 * We use incorrect constants for things like arena ind, zero, ranged,
	 * and commit state, and head status.  This is a fake edata_t, used to
	 * facilitate a lookup.
	 */
	edata_t lead = {0};
	edata_init(&lead, 0U, edata_addr_get(edata), size_a, false, 0, 0,
	    extent_state_active, false, false, EXTENT_PAI_PAC, EXTENT_NOT_HEAD);

	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, &lead, false, true,
	    &prepare->lead_elm_a, &prepare->lead_elm_b);
	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, trail, false, true,
	    &prepare->trail_elm_a, &prepare->trail_elm_b);

	if (prepare->lead_elm_a == NULL || prepare->lead_elm_b == NULL
	    || prepare->trail_elm_a == NULL || prepare->trail_elm_b == NULL) {
		return true;
	}
	return false;
}